

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH64_hash_t
XXH3_hashLong_64b_internal
          (void *input,size_t len,void *secret,size_t secretSize,XXH3_f_accumulate_512 f_acc512,
          XXH3_f_scrambleAcc f_scramble)

{
  XXH64_hash_t XVar1;
  XXH3_f_scrambleAcc in_RCX;
  xxh_u64 *in_R9;
  xxh_u64 acc [8];
  xxh_u64 in_stack_ffffffffffffff80;
  xxh_u8 *in_stack_ffffffffffffff88;
  xxh_u64 *in_stack_ffffffffffffff90;
  XXH3_f_accumulate_512 in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  xxh_u8 *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  xxh_u8 *in_stack_ffffffffffffffc8;
  
  memcpy(&stack0xffffffffffffff88,&DAT_001266c0,0x40);
  XXH3_hashLong_internal_loop
            (in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RCX);
  XVar1 = XXH3_mergeAccs(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                         in_stack_ffffffffffffff80);
  return XVar1;
}

Assistant:

XXH_FORCE_INLINE XXH64_hash_t XXH3_hashLong_64b_internal(
    const void* XXH_RESTRICT input, size_t len, const void* XXH_RESTRICT secret,
    size_t secretSize, XXH3_f_accumulate_512 f_acc512,
    XXH3_f_scrambleAcc f_scramble) {
  XXH_ALIGN(XXH_ACC_ALIGN) xxh_u64 acc[XXH_ACC_NB] = XXH3_INIT_ACC;

  XXH3_hashLong_internal_loop(acc, (const xxh_u8*)input, len,
                              (const xxh_u8*)secret, secretSize, f_acc512,
                              f_scramble);

  /* converge into final hash */
  XXH_STATIC_ASSERT(sizeof(acc) == 64);
  /* do not align on 8, so that the secret is different from the accumulator */
#define XXH_SECRET_MERGEACCS_START 11
  XXH_ASSERT(secretSize >= sizeof(acc) + XXH_SECRET_MERGEACCS_START);
  return XXH3_mergeAccs(acc, (const xxh_u8*)secret + XXH_SECRET_MERGEACCS_START,
                        (xxh_u64)len * XXH_PRIME64_1);
}